

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ManchesterSimulationDataGenerator.cpp
# Opt level: O0

void __thiscall
ManchesterSimulationDataGenerator::Initialize
          (ManchesterSimulationDataGenerator *this,U32 simulation_sample_rate,
          ManchesterAnalyzerSettings *settings)

{
  U64 UVar1;
  BitState BVar2;
  double half_period;
  ManchesterAnalyzerSettings *settings_local;
  U32 simulation_sample_rate_local;
  ManchesterSimulationDataGenerator *this_local;
  
  this->mSimulationSampleRateHz = simulation_sample_rate;
  this->mSettings = settings;
  SimulationChannelDescriptor::SetChannel((Channel *)&this->mManchesterSimulationData);
  BVar2 = (BitState)&this->mManchesterSimulationData;
  SimulationChannelDescriptor::SetSampleRate(BVar2);
  SimulationChannelDescriptor::SetInitialBitState(BVar2);
  UVar1 = UsToSamples(this,(1.0 / (double)(this->mSettings->mBitRate * 2)) * 1000000.0);
  this->mT = UVar1;
  this->mSimValue = 1;
  if (0x20 < this->mSettings->mBitsPerTransfer) {
    this->mSimValue = 0xffffffff;
  }
  SimulationChannelDescriptor::Advance((int)this + 0x20);
  return;
}

Assistant:

void ManchesterSimulationDataGenerator::Initialize( U32 simulation_sample_rate, ManchesterAnalyzerSettings* settings )
{
    mSimulationSampleRateHz = simulation_sample_rate;
    mSettings = settings;

    mManchesterSimulationData.SetChannel( mSettings->mInputChannel );
    mManchesterSimulationData.SetSampleRate( simulation_sample_rate );

    mManchesterSimulationData.SetInitialBitState( BIT_LOW );

    double half_period = 1.0 / double( mSettings->mBitRate * 2 );
    half_period *= 1000000.0;
    mT = UsToSamples( half_period );
    mSimValue = 1;

    if( mSettings->mBitsPerTransfer > 32 )
    {
        mSimValue = 0xFFFFFFFF;
    }

    mManchesterSimulationData.Advance( U32( mT * 8 ) );
}